

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O0

uint32_t farmhashcc::Hash32WithSeed(char *s,size_t len,uint32_t seed)

{
  uint32_t uVar1;
  ulong in_RSI;
  undefined8 in_RDI;
  char *unaff_retaddr;
  uint32_t h;
  size_t in_stack_00000020;
  char *in_stack_00000028;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  uVar1 = (uint32_t)((ulong)in_RDI >> 0x20);
  if (in_RSI < 0x19) {
    if (in_RSI < 0xd) {
      if (in_RSI < 5) {
        uVar1 = farmhashmk::Hash32Len0to4
                          (unaff_retaddr,
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),uVar1);
      }
      else {
        uVar1 = farmhashmk::Hash32Len5to12
                          (unaff_retaddr,
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),uVar1);
      }
    }
    else {
      uVar1 = farmhashmk::Hash32Len13to24
                        (unaff_retaddr,CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                         ,uVar1);
    }
  }
  else {
    farmhashmk::Hash32Len13to24
              (unaff_retaddr,CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),uVar1);
    Hash32(in_stack_00000028,in_stack_00000020);
    uVar1 = util::Mur(0,0x20ca10);
  }
  return uVar1;
}

Assistant:

uint32_t Hash32WithSeed(const char *s, size_t len, uint32_t seed) {
  if (len <= 24) {
    if (len >= 13) return farmhashmk::Hash32Len13to24(s, len, seed * c1);
    else if (len >= 5) return farmhashmk::Hash32Len5to12(s, len, seed);
    else return farmhashmk::Hash32Len0to4(s, len, seed);
  }
  uint32_t h = farmhashmk::Hash32Len13to24(s, 24, seed ^ len);
  return Mur(Hash32(s + 24, len - 24) + seed, h);
}